

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

snd_config_t * init_local_config_with_workaround(char *pcm_name)

{
  snd_config_t *psVar1;
  int iVar2;
  char *in_RDI;
  char node_name [64];
  char *string;
  snd_config_t *node;
  snd_config_t *pcm_node;
  snd_config_t *lconf;
  int r;
  char acStack_78 [64];
  char *local_38;
  snd_config_t *local_30;
  snd_config_t *local_28;
  snd_config_t *local_20;
  int local_14;
  char *local_10;
  
  local_20 = (snd_config_t *)0x0;
  if ((*cubeb_snd_config != (snd_config_t *)0x0) &&
     (local_10 = in_RDI, local_14 = (*cubeb_snd_config_copy)(&local_20,*cubeb_snd_config),
     -1 < local_14)) {
    local_14 = (*cubeb_snd_config_search_definition)(local_20,"pcm",local_10,&local_28);
    if ((-1 < local_14) &&
       ((((local_14 = (*cubeb_snd_config_get_id)(local_28,&local_38), -1 < local_14 &&
          (local_14 = snprintf(acStack_78,0x40,"pcm.%s",local_38), -1 < local_14)) &&
         (local_14 < 0x41)) &&
        (local_14 = (*cubeb_snd_config_search)(local_20,acStack_78,&local_28), psVar1 = local_28,
        -1 < local_14)))) {
      do {
        local_28 = psVar1;
        local_30 = get_slave_pcm_node((snd_config_t *)node_name._24_8_,
                                      (snd_config_t *)node_name._16_8_);
        psVar1 = local_30;
      } while (local_30 != (snd_config_t *)0x0);
      local_14 = (*cubeb_snd_config_search)(local_28,"type",&local_30);
      if ((((-1 < local_14) &&
           (local_14 = (*cubeb_snd_config_get_string)(local_30,&local_38), -1 < local_14)) &&
          ((iVar2 = strcmp(local_38,"pulse"), iVar2 == 0 &&
           ((local_14 = (*cubeb_snd_config_search)(local_28,"handle_underrun",&local_30),
            local_14 == -2 &&
            (local_14 = (*cubeb_snd_config_imake_integer)(&local_30,"handle_underrun",0),
            -1 < local_14)))))) &&
         (local_14 = (*cubeb_snd_config_add)(local_28,local_30), -1 < local_14)) {
        return local_20;
      }
    }
    (*cubeb_snd_config_delete)(local_20);
  }
  return (snd_config_t *)0x0;
}

Assistant:

static snd_config_t *
init_local_config_with_workaround(char const * pcm_name)
{
  int r;
  snd_config_t * lconf;
  snd_config_t * pcm_node;
  snd_config_t * node;
  char const * string;
  char node_name[64];

  lconf = NULL;

  if (*WRAP(snd_config) == NULL) {
    return NULL;
  }

  r = WRAP(snd_config_copy)(&lconf, *WRAP(snd_config));
  if (r < 0) {
    return NULL;
  }

  do {
    r = WRAP(snd_config_search_definition)(lconf, "pcm", pcm_name, &pcm_node);
    if (r < 0) {
      break;
    }

    r = WRAP(snd_config_get_id)(pcm_node, &string);
    if (r < 0) {
      break;
    }

    r = snprintf(node_name, sizeof(node_name), "pcm.%s", string);
    if (r < 0 || r > (int) sizeof(node_name)) {
      break;
    }
    r = WRAP(snd_config_search)(lconf, node_name, &pcm_node);
    if (r < 0) {
      break;
    }

    /* If this PCM has a slave, walk the slave configurations until we reach the bottom. */
    while ((node = get_slave_pcm_node(lconf, pcm_node)) != NULL) {
      pcm_node = node;
    }

    /* Fetch the PCM node's type, and bail out if it's not the PulseAudio plugin. */
    r = WRAP(snd_config_search)(pcm_node, "type", &node);
    if (r < 0) {
      break;
    }

    r = WRAP(snd_config_get_string)(node, &string);
    if (r < 0) {
      break;
    }

    if (strcmp(string, "pulse") != 0) {
      break;
    }

    /* Don't clobber an explicit existing handle_underrun value, set it only
       if it doesn't already exist. */
    r = WRAP(snd_config_search)(pcm_node, "handle_underrun", &node);
    if (r != -ENOENT) {
      break;
    }

    /* Disable pcm_pulse's asynchronous underrun handling. */
    r = WRAP(snd_config_imake_integer)(&node, "handle_underrun", 0);
    if (r < 0) {
      break;
    }

    r = WRAP(snd_config_add)(pcm_node, node);
    if (r < 0) {
      break;
    }

    return lconf;
  } while (0);

  WRAP(snd_config_delete)(lconf);

  return NULL;
}